

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O1

LPVOID HeapAlloc(HANDLE hHeap,DWORD dwFlags,SIZE_T numberOfBytes)

{
  void *__s;
  DWORD dwErrCode;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00132758;
  if (hHeap == (HANDLE)0x1020304) {
    if ((dwFlags & 0xfffffff7) == 0) {
      __s = PAL_malloc(numberOfBytes);
      if (__s == (void *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00132758;
        dwErrCode = 8;
        goto LAB_001326a1;
      }
      if (dwFlags == 8) {
        memset(__s,0,numberOfBytes);
      }
    }
    else {
      __s = (LPVOID)0x0;
      fprintf(_stderr,"] %s %s:%d","HeapAlloc",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
              ,0xf0);
      fprintf(_stderr,"Invalid parameter dwFlags=%#x\n",(ulong)dwFlags);
      SetLastError(0x57);
    }
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_00132758;
  }
  else {
    dwErrCode = 0x57;
LAB_001326a1:
    SetLastError(dwErrCode);
    if (PAL_InitializeChakraCoreCalled == false) {
LAB_00132758:
      abort();
    }
    __s = (LPVOID)0x0;
  }
  return __s;
}

Assistant:

LPVOID
PALAPI
HeapAlloc(
    IN HANDLE hHeap,
    IN DWORD dwFlags,
    IN SIZE_T numberOfBytes)
{
    BYTE *pMem;

    PERF_ENTRY(HeapAlloc);
    ENTRY("HeapAlloc (hHeap=%p, dwFlags=%#x, numberOfBytes=%u)\n",
          hHeap, dwFlags, numberOfBytes);

#ifdef __APPLE__
    if (hHeap == NULL)
#else // __APPLE__
    if (hHeap != (HANDLE) DUMMY_HEAP)
#endif // __APPLE__ else
    {
        ERROR("Invalid heap handle\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        LOGEXIT("HeapAlloc returning NULL\n");
        PERF_EXIT(HeapAlloc);
        return NULL;
    }

    if ((dwFlags != 0) && (dwFlags != HEAP_ZERO_MEMORY))
    {
        ASSERT("Invalid parameter dwFlags=%#x\n", dwFlags);
        SetLastError(ERROR_INVALID_PARAMETER);
        LOGEXIT("HeapAlloc returning NULL\n");
        PERF_EXIT(HeapAlloc);
        return NULL;
    }

#ifdef __APPLE__
    // This is patterned off of InternalMalloc in malloc.cpp.
    {
        pMem = (BYTE *)malloc_zone_malloc((malloc_zone_t *)hHeap, numberOfBytes);
    }
#else // __APPLE__
    pMem = (BYTE *) PAL_malloc(numberOfBytes);
#endif // __APPLE__ else

    if (pMem == NULL)
    {
        ERROR("Not enough memory\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        LOGEXIT("HeapAlloc returning NULL\n");
        PERF_EXIT(HeapAlloc);
        return NULL;
    }

    /* If the HEAP_ZERO_MEMORY flag is set initialize to zero */
    if (dwFlags == HEAP_ZERO_MEMORY)
    {
        memset(pMem, 0, numberOfBytes);
    }

    LOGEXIT("HeapAlloc returning LPVOID %p\n", pMem);
    PERF_EXIT(HeapAlloc);
    return (pMem);
}